

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildRecursive
          (BVHAggregate *this,
          vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
          *threadAllocators,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,int start,
          int end,atomic<int> *totalNodes,atomic<int> *orderedPrimsOffset,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  float fVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar9;
  undefined4 uVar13;
  undefined4 uVar14;
  memory_resource *pmVar15;
  pointer pPVar16;
  pointer pPVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  ushort uVar22;
  long lVar23;
  size_t sVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  size_t sVar31;
  undefined8 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined4 uVar103;
  undefined4 uVar104;
  undefined4 uVar105;
  undefined4 uVar106;
  undefined4 uVar107;
  undefined4 uVar108;
  undefined4 uVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  undefined4 uVar112;
  undefined4 uVar113;
  undefined4 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined4 uVar117;
  undefined4 uVar118;
  undefined4 uVar119;
  undefined4 uVar120;
  undefined4 uVar121;
  undefined4 uVar122;
  undefined4 uVar123;
  undefined4 uVar124;
  undefined4 uVar125;
  undefined4 uVar126;
  undefined4 uVar127;
  undefined4 uVar128;
  BVHPrimitive __value;
  BVHPrimitive __value_00;
  BVHPrimitive __value_01;
  BVHPrimitive __value_02;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [12];
  undefined8 uVar134;
  undefined4 uVar135;
  undefined8 uVar136;
  undefined1 auVar137 [12];
  undefined1 auVar138 [12];
  undefined8 uVar139;
  undefined1 auVar140 [12];
  undefined1 auVar141 [12];
  undefined8 uVar142;
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined8 uVar145;
  undefined1 auVar146 [12];
  undefined1 auVar147 [12];
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *pvVar148;
  size_t *psVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims_00;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *pvVar155;
  undefined1 threadAllocators_00 [8];
  BVHAggregate *this_00;
  int iVar156;
  undefined4 extraout_var;
  long lVar157;
  ulong uVar158;
  long lVar159;
  ulong uVar160;
  uint uVar161;
  float *pfVar162;
  pointer pBVar163;
  BVHPrimitive *pBVar164;
  BVHPrimitive *__i;
  undefined4 uVar165;
  long lVar166;
  _Any_data *p_Var167;
  pointer pBVar168;
  pointer pBVar169;
  byte bVar170;
  pointer pBVar171;
  int *piVar172;
  int *piVar173;
  pointer pBVar174;
  long lVar175;
  undefined4 *puVar176;
  undefined8 *puVar177;
  pointer pBVar178;
  int iVar179;
  Point3f *pPVar180;
  pointer pBVar181;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:257:34)>
  __comp;
  pointer pBVar182;
  int *in_FS_OFFSET;
  bool bVar183;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [64];
  float fVar203;
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [16];
  float fVar211;
  float fVar212;
  undefined1 auVar213 [64];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  BVHSplitBucket buckets [12];
  BVHBuildNode *children [2];
  int countAbove [11];
  int countBelow [11];
  Bounds3f boundsAbove [11];
  int local_494;
  int local_490;
  int local_48c;
  atomic<int> *local_488;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_480;
  BVHBuildNode *local_478;
  pointer local_470;
  pointer local_468;
  undefined1 local_460 [8];
  undefined8 local_458;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_450;
  _Any_data local_448;
  uint uStack_438;
  undefined4 uStack_434;
  uint auStack_430 [4];
  undefined4 uStack_420;
  undefined4 uStack_41c;
  int local_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  long *local_2f8;
  undefined8 local_2f0;
  code *local_2e8;
  code *local_2e0;
  size_t sStack_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  uint auStack_2bc [5];
  BVHBuildNode *local_2a8;
  BVHBuildNode *pBStack_2a0;
  undefined4 local_27c [57];
  int aiStack_198 [78];
  undefined8 local_60 [3];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  BVHBuildNode *this_01;
  undefined1 auVar194 [64];
  
  local_494 = end;
  local_490 = start;
  local_450 = (vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)totalNodes;
  pbrt::ThreadIndex::__tls_init();
  pmVar15 = (threadAllocators->
            super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
            )._M_impl.super__Vector_impl_data._M_start[*in_FS_OFFSET].memoryResource;
  iVar156 = (*pmVar15->_vptr_memory_resource[2])(pmVar15,0x38,8);
  this_01 = (BVHBuildNode *)CONCAT44(extraout_var,iVar156);
  auVar196._8_4_ = 0xff7fffff;
  auVar196._0_8_ = 0xff7fffffff7fffff;
  auVar196._12_4_ = 0xff7fffff;
  this_01->children[0] = (BVHBuildNode *)0x0;
  this_01->children[1] = (BVHBuildNode *)0x0;
  this_01->splitAxis = 0;
  this_01->firstPrimOffset = 0;
  *(undefined8 *)&this_01->nPrimitives = 0;
  (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff;
  uVar8 = vmovlps_avx(auVar196);
  (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar8;
  (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar8 >> 0x20);
  LOCK();
  (totalNodes->super___atomic_base<int>)._M_i = (totalNodes->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  lVar159 = (long)local_490;
  lVar157 = (long)local_494;
  if (local_490 < local_494) {
    auVar205._8_4_ = 0x7f7fffff;
    auVar205._0_8_ = 0x7f7fffff7f7fffff;
    auVar205._12_4_ = 0x7f7fffff;
    auVar196._8_4_ = 0xff7fffff;
    auVar196._0_8_ = 0xff7fffffff7fffff;
    auVar196._12_4_ = 0xff7fffff;
    auVar204 = ZEXT464(0x7f7fffff);
    auVar202 = ZEXT464(0xff7fffff);
    pfVar162 = &(bvhPrimitives->
                super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl
                .super__Vector_impl_data._M_start[lVar159].bounds.pMax.
                super_Tuple3<pbrt::Point3,_float>.z;
    lVar166 = lVar157 - lVar159;
    do {
      auVar195._8_8_ = 0;
      auVar195._0_8_ = *(ulong *)(pfVar162 + -5);
      uVar3 = ((Tuple3<pbrt::Point3,_float> *)(pfVar162 + -2))->x;
      uVar10 = ((Tuple3<pbrt::Point3,_float> *)(pfVar162 + -2))->y;
      auVar207._4_4_ = uVar10;
      auVar207._0_4_ = uVar3;
      auVar207._8_8_ = 0;
      auVar188 = vminss_avx(ZEXT416((uint)pfVar162[-3]),auVar204._0_16_);
      auVar204 = ZEXT1664(auVar188);
      fVar184 = *pfVar162;
      auVar205 = vminps_avx(auVar195,auVar205);
      auVar196 = vmaxps_avx(auVar207,auVar196);
      pfVar162 = pfVar162 + 0xc;
      lVar166 = lVar166 + -1;
      auVar188 = vmaxss_avx(ZEXT416((uint)fVar184),auVar202._0_16_);
      auVar202 = ZEXT1664(auVar188);
    } while (lVar166 != 0);
  }
  else {
    auVar205._8_4_ = 0x7f7fffff;
    auVar205._0_8_ = 0x7f7fffff7f7fffff;
    auVar205._12_4_ = 0x7f7fffff;
    auVar202 = ZEXT464(0xff7fffff);
    auVar204 = ZEXT464(0x7f7fffff);
  }
  auVar195 = vsubps_avx(auVar196,auVar205);
  fVar197 = auVar202._0_4_;
  fVar203 = auVar204._0_4_;
  uVar161 = local_494 - local_490;
  auVar188 = vmovshdup_avx(auVar195);
  auVar195 = vfmadd231ss_fma(ZEXT416((uint)(auVar195._0_4_ * (fVar197 - fVar203))),auVar188,auVar195
                            );
  auVar188 = vfmadd231ss_fma(auVar195,auVar188,ZEXT416((uint)(fVar197 - fVar203)));
  fVar184 = auVar188._0_4_ + auVar188._0_4_;
  if (((fVar184 == 0.0) && (!NAN(fVar184))) || (uVar161 == 1)) {
    LOCK();
    iVar156 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar161;
    UNLOCK();
    if (local_490 < local_494) {
      pPVar16 = (this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar17 = (orderedPrims->
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar157 = (long)local_494 - (long)local_490;
      pBVar178 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_490;
      iVar179 = iVar156;
      do {
        psVar149 = &pBVar178->primitiveIndex;
        pBVar178 = pBVar178 + 1;
        pPVar17[iVar179].
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = pPVar16[(int)*psVar149].
                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                .bits;
        iVar179 = iVar179 + 1;
        lVar157 = lVar157 + -1;
      } while (lVar157 != 0);
    }
  }
  else {
    if (local_490 < local_494) {
      auVar188._8_4_ = 0xff7fffff;
      auVar188._0_8_ = 0xff7fffffff7fffff;
      auVar188._12_4_ = 0xff7fffff;
      auVar210._8_4_ = 0x7f7fffff;
      auVar210._0_8_ = 0x7f7fffff7f7fffff;
      auVar210._12_4_ = 0x7f7fffff;
      auVar213 = ZEXT464(0xff7fffff);
      auVar208 = ZEXT464(0x7f7fffff);
      pfVar162 = &(bvhPrimitives->
                  super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar159].centroid.
                  super_Tuple3<pbrt::Point3,_float>.z;
      lVar166 = lVar157 - lVar159;
      do {
        fVar1 = *pfVar162;
        uVar4 = ((Tuple3<pbrt::Point3,_float> *)(pfVar162 + -2))->x;
        uVar11 = ((Tuple3<pbrt::Point3,_float> *)(pfVar162 + -2))->y;
        auVar186._4_4_ = uVar11;
        auVar186._0_4_ = uVar4;
        auVar186._8_8_ = 0;
        pfVar162 = pfVar162 + 0xc;
        lVar166 = lVar166 + -1;
        auVar207 = vminss_avx(ZEXT416((uint)fVar1),auVar208._0_16_);
        auVar208 = ZEXT1664(auVar207);
        auVar210 = vminps_avx(auVar186,auVar210);
        auVar188 = vmaxps_avx(auVar186,auVar188);
        auVar195 = vmaxss_avx(ZEXT416((uint)fVar1),auVar213._0_16_);
        auVar213 = ZEXT1664(auVar195);
      } while (lVar166 != 0);
    }
    else {
      auVar210._8_4_ = 0x7f7fffff;
      auVar210._0_8_ = 0x7f7fffff7f7fffff;
      auVar210._12_4_ = 0x7f7fffff;
      auVar188._8_4_ = 0xff7fffff;
      auVar188._0_8_ = 0xff7fffffff7fffff;
      auVar188._12_4_ = 0xff7fffff;
      auVar207 = SUB6416(ZEXT464(0x7f7fffff),0);
      auVar195 = SUB6416(ZEXT464(0xff7fffff),0);
    }
    auVar186 = vmovshdup_avx(auVar188);
    fVar211 = auVar186._0_4_;
    auVar18 = vmovshdup_avx(auVar210);
    fVar212 = auVar18._0_4_;
    fVar206 = auVar207._0_4_;
    fVar1 = auVar195._0_4_ - fVar206;
    auVar18 = vsubps_avx(auVar188,auVar210);
    fVar19 = fVar211 - fVar212;
    auVar208 = ZEXT464((uint)fVar19);
    uVar8 = vcmpps_avx512vl(ZEXT416((uint)fVar1),auVar18,5);
    uVar21 = vcmpps_avx512vl(ZEXT416((uint)fVar19),auVar18,5);
    uVar22 = (ushort)uVar21 | (ushort)uVar8;
    __comp._M_comp.dim = (anon_class_4_1_ba1d3fe8)(anon_class_4_1_ba1d3fe8)0;
    if ((uVar22 & 1) != 0) {
      __comp._M_comp.dim = (anon_class_4_1_ba1d3fe8)(anon_class_4_1_ba1d3fe8)((fVar19 <= fVar1) + 1)
      ;
    }
    local_48c = (local_490 + local_494) / 2;
    fVar209 = auVar210._0_4_;
    fVar214 = fVar212;
    if ((__comp._M_comp.dim != 1) &&
       (auVar186 = auVar188, fVar214 = fVar209, __comp._M_comp.dim != 0)) {
      auVar186 = auVar195;
      fVar214 = fVar206;
    }
    if ((auVar186._0_4_ != fVar214) || (NAN(auVar186._0_4_) || NAN(fVar214))) {
      bVar170 = (byte)uVar22;
      fVar214 = auVar188._0_4_;
      iVar156 = local_48c;
      local_460 = (undefined1  [8])threadAllocators;
      local_458 = this;
      if (this->splitMethod == Middle) {
        if ((__comp._M_comp.dim != 1) &&
           (fVar211 = fVar214, fVar212 = fVar209, __comp._M_comp.dim != 0)) {
          fVar211 = auVar195._0_4_;
          fVar212 = fVar206;
        }
        pBVar174 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar178 = pBVar174 + lVar159;
        if (local_490 != local_494) {
          fVar184 = (fVar212 + fVar211) * 0.5;
          pBVar174 = pBVar174 + lVar157;
          pBVar182 = pBVar178;
          do {
            while( true ) {
              pBVar178 = pBVar182;
              if (__comp._M_comp.dim == 0) {
                pPVar180 = &pBVar178->centroid;
              }
              else if (__comp._M_comp.dim == 1) {
                pPVar180 = (Point3f *)&(pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              }
              else {
                pPVar180 = (Point3f *)&(pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              }
              if ((pPVar180->super_Tuple3<pbrt::Point3,_float>).x < fVar184) break;
              do {
                pBVar163 = pBVar174;
                pBVar174 = pBVar163 + -1;
                if (pBVar174 == pBVar178) goto LAB_0042669b;
                if (__comp._M_comp.dim == 0) {
                  pPVar180 = &pBVar163[-1].centroid;
                }
                else if (__comp._M_comp.dim == 1) {
                  pPVar180 = (Point3f *)&pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                }
                else {
                  pPVar180 = (Point3f *)&pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                }
              } while (fVar184 <= (pPVar180->super_Tuple3<pbrt::Point3,_float>).x);
              uVar8 = *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>;
              uVar134 = pBVar178->primitiveIndex;
              uVar135 = (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
              auVar129._8_4_ = uVar135;
              auVar129._0_8_ = uVar134;
              uVar21 = *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
              uVar105 = (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar106 = (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
              uVar107 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.x;
              uVar108 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y;
              uVar32 = *(undefined8 *)&(pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z;
              uStack_420 = (undefined4)uVar32;
              uStack_41c = (undefined4)((ulong)uVar32 >> 0x20);
              local_448._0_4_ = (undefined4)pBVar178->primitiveIndex;
              local_448._4_4_ = (undefined4)(pBVar178->primitiveIndex >> 0x20);
              local_448._8_4_ = (undefined4)uVar8;
              local_448._12_4_ = (undefined4)((ulong)uVar8 >> 0x20);
              uStack_438 = (uint)uVar21;
              uStack_434 = (undefined4)((ulong)uVar21 >> 0x20);
              sVar24 = pBVar174->primitiveIndex;
              uVar8 = *(undefined8 *)&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
              uVar21 = *(undefined8 *)&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar214 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              fVar209 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar197 = pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
              fVar203 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
              fVar211 = pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
              uVar32 = *(undefined8 *)&pBVar163[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
              fVar212 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
              fVar206 = pBVar163[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
              (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
              (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar197;
              (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar203;
              (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar211;
              *(undefined8 *)&(pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
              (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar212;
              (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar206;
              pBVar178->primitiveIndex = sVar24;
              *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float> = uVar8;
              *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
              (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
              (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar209;
              pBVar182 = pBVar178 + 1;
              auVar129._12_4_ = local_448._12_4_;
              auVar129._16_4_ = uStack_438;
              auVar129._20_4_ = uStack_434;
              auVar129._24_4_ = uVar105;
              auVar129._28_4_ = uVar106;
              auVar130._4_4_ = uStack_438;
              auVar130._0_4_ = local_448._12_4_;
              auVar130._8_4_ = uStack_434;
              auVar130._12_4_ = uVar105;
              auVar130._16_4_ = uVar106;
              auVar130._20_4_ = uVar107;
              auVar130._24_4_ = uVar108;
              auVar130._28_4_ = uStack_420;
              *(undefined1 (*) [32])&pBVar163[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   auVar130;
              pBVar174->primitiveIndex = uVar134;
              (pBVar174->bounds).pMin = (Point3<float>)SUB2412(auVar129._8_24_,0);
              (pBVar174->bounds).pMax = (Point3<float>)SUB2412(auVar129._8_24_,0xc);
              pBVar178 = pBVar174;
              auStack_430[0] = uVar105;
              auStack_430[1] = uVar106;
              auStack_430[2] = uVar107;
              auStack_430[3] = uVar108;
              if (pBVar174 == pBVar182) goto LAB_0042669b;
            }
            pBVar182 = pBVar178 + 1;
            pBVar178 = pBVar174;
          } while (pBVar182 != pBVar174);
        }
LAB_0042669b:
        pBVar174 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        iVar156 = (int)((ulong)((long)pBVar178 - (long)pBVar174) >> 4) * -0x55555555;
        if (local_490 != iVar156 && local_494 != iVar156) goto LAB_0042799f;
LAB_004266c8:
        iVar156 = local_48c;
        if (local_48c == local_494 || local_490 == local_494) goto LAB_0042799f;
        pBVar178 = pBVar174 + lVar157;
        pBVar182 = pBVar174 + lVar159;
        uVar158 = lVar157 * 0x30 + lVar159 * -0x30;
        if ((long)uVar158 < 0x91) {
LAB_00426e7a:
          if ((pBVar182 != pBVar178) && (pBVar174 = pBVar182 + 1, pBVar174 != pBVar178)) {
            pBVar163 = pBVar182;
            lVar157 = 0x20;
            if ((uVar22 & 1) != 0) {
              lVar157 = (ulong)((byte)(~bVar170 | fVar19 <= fVar1) & 1) * 4 + 0x24;
            }
            do {
              pBVar168 = pBVar174;
              if (*(float *)((long)&pBVar182->primitiveIndex + lVar157) <=
                  *(float *)((long)&pBVar168->primitiveIndex + lVar157)) {
                sVar24 = pBVar168->primitiveIndex;
                uVar99 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar100 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar101 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar102 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar103 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar104 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar21 = *(undefined8 *)&(pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                auStack_430[2] = uVar103;
                auStack_430[3] = uVar104;
                uStack_420 = (undefined4)uVar21;
                uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
                local_448._0_4_ = (undefined4)sVar24;
                local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
                local_448._8_4_ = uVar99;
                local_448._12_4_ = uVar100;
                uStack_438 = (uint)uVar8;
                uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
                auStack_430[0] = uVar101;
                auStack_430[1] = uVar102;
                fVar184 = *(float *)((long)&local_448 + lVar157);
                fVar197 = *(float *)((long)&pBVar163->primitiveIndex + lVar157);
                pBVar174 = pBVar168;
                while (fVar184 < fVar197) {
                  sVar31 = pBVar174[-1].primitiveIndex;
                  fVar197 = pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar203 = pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar21 = *(undefined8 *)
                            &pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar1 = pBVar174[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar19 = pBVar174[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  *(undefined1 (*) [32])&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y
                       = *(undefined1 (*) [32])
                          &pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  pBVar174->primitiveIndex = sVar31;
                  (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
                  (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
                  *(undefined8 *)&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar21;
                  (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar1;
                  (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar19;
                  fVar197 = *(float *)((long)&pBVar174[-2].primitiveIndex + lVar157);
                  pBVar174 = pBVar174 + -1;
                }
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar100;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar101;
                *(ulong *)&(pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(auStack_430[2],auStack_430[1]);
                (pBVar174->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar104;
                (pBVar174->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                pBVar174->primitiveIndex = sVar24;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar99;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar100;
                *(undefined8 *)&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar101;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar102;
              }
              else {
                uVar93 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar94 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar95 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar96 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar97 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar98 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar21 = *(undefined8 *)&(pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar21;
                uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
                local_448._0_4_ = (undefined4)pBVar168->primitiveIndex;
                local_448._4_4_ = (undefined4)(pBVar168->primitiveIndex >> 0x20);
                uStack_438 = (uint)uVar8;
                uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._8_4_ = uVar93;
                local_448._12_4_ = uVar94;
                auStack_430[0] = uVar95;
                auStack_430[1] = uVar96;
                auStack_430[2] = uVar97;
                auStack_430[3] = uVar98;
                memmove((void *)((long)pBVar163 + (0x60 - ((long)pBVar168 - (long)pBVar182))),
                        pBVar182,(long)pBVar168 - (long)pBVar182);
                pBVar182->primitiveIndex = CONCAT44(local_448._4_4_,local_448._0_4_);
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_448._8_4_
                ;
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                *(ulong *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(uStack_434,uStack_438);
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)auStack_430[1];
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                *(ulong *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(auStack_430[2],auStack_430[1]);
                (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[3];
                (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
              }
              pBVar174 = pBVar168 + 1;
              pBVar163 = pBVar168;
              iVar156 = local_48c;
            } while (pBVar168 + 1 != pBVar178);
          }
          goto LAB_0042799f;
        }
        pBVar174 = pBVar174 + local_48c;
        lVar157 = 0x20;
        if ((uVar22 & 1) != 0) {
          lVar157 = (ulong)((byte)(~bVar170 | fVar19 <= fVar1) & 1) * 4 + 0x24;
        }
        uVar160 = (ulong)(uint)((int)LZCOUNT((uVar158 >> 4) * -0x5555555555555555) * 2) ^ 0x7e;
        do {
          fVar184 = *(float *)((long)&pBVar182[1].primitiveIndex + lVar157);
          fVar197 = *(float *)((long)&pBVar178[-1].primitiveIndex + lVar157);
          pBVar163 = pBVar182 + 1;
          pBVar168 = pBVar182 + uVar158 / 0x60;
          fVar203 = *(float *)((long)&pBVar168->primitiveIndex + lVar157);
          if (fVar203 <= fVar184) {
            if (fVar197 <= fVar184) {
              if (fVar203 < fVar197) goto LAB_004267fa;
              goto LAB_0042684e;
            }
LAB_004267a1:
            sVar24 = pBVar182->primitiveIndex;
            uVar25 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar26 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar27 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar28 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar29 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar30 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar163->primitiveIndex;
            fVar206 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar29,uVar28);
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar26;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar27;
            *(undefined8 *)&pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar30;
            pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar163->primitiveIndex = sVar24;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar25;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar26;
            *(undefined8 *)&pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar27;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar28;
            local_448._8_4_ = uVar25;
            local_448._12_4_ = uVar26;
            auStack_430[0] = uVar27;
            auStack_430[1] = uVar28;
            auStack_430[2] = uVar29;
            auStack_430[3] = uVar30;
          }
          else if (fVar203 < fVar197) {
LAB_0042684e:
            sVar24 = pBVar182->primitiveIndex;
            uVar39 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar40 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar41 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar42 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar43 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar44 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar168->primitiveIndex;
            fVar206 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&(pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar43,uVar42);
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar40;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar41;
            *(undefined8 *)&(pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar44;
            (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar168->primitiveIndex = sVar24;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar39;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar40;
            *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar41;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar42;
            local_448._8_4_ = uVar39;
            local_448._12_4_ = uVar40;
            auStack_430[0] = uVar41;
            auStack_430[1] = uVar42;
            auStack_430[2] = uVar43;
            auStack_430[3] = uVar44;
          }
          else {
            if (fVar197 <= fVar184) goto LAB_004267a1;
LAB_004267fa:
            sVar24 = pBVar182->primitiveIndex;
            uVar33 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar34 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar35 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar36 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar37 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar38 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar178[-1].primitiveIndex;
            fVar206 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar37,uVar36);
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar34;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar35;
            *(undefined8 *)&pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar38;
            pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar178[-1].primitiveIndex = sVar24;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar33;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar34;
            *(undefined8 *)&pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar35;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar36;
            local_448._8_4_ = uVar33;
            local_448._12_4_ = uVar34;
            auStack_430[0] = uVar35;
            auStack_430[1] = uVar36;
            auStack_430[2] = uVar37;
            auStack_430[3] = uVar38;
          }
          uVar160 = uVar160 - 1;
          pBVar168 = pBVar178;
          while( true ) {
            fVar184 = *(float *)((long)&pBVar182->primitiveIndex + lVar157);
            pBVar181 = pBVar163 + -1;
            do {
              pBVar171 = pBVar181;
              pBVar181 = pBVar171 + 1;
            } while (*(float *)((long)&pBVar171[1].primitiveIndex + lVar157) < fVar184);
            pBVar163 = pBVar171 + 2;
            do {
              pBVar169 = pBVar168;
              pBVar168 = pBVar169 + -1;
            } while (fVar184 < *(float *)((long)&pBVar169[-1].primitiveIndex + lVar157));
            if (pBVar168 <= pBVar181) break;
            sVar24 = pBVar181->primitiveIndex;
            uVar45 = pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar46 = pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar47 = pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar48 = pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar49 = pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
            uVar50 = pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar168->primitiveIndex;
            fVar206 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar181->primitiveIndex = sVar31;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar49,uVar48);
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar46;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar47;
            *(undefined8 *)&pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar50;
            pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar168->primitiveIndex = sVar24;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar45;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar46;
            *(undefined8 *)&pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar47;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar48;
            local_448._8_4_ = uVar45;
            local_448._12_4_ = uVar46;
            auStack_430[0] = uVar47;
            auStack_430[1] = uVar48;
            auStack_430[2] = uVar49;
            auStack_430[3] = uVar50;
          }
          if (pBVar181 <= pBVar174) {
            pBVar182 = pBVar181;
            pBVar181 = pBVar178;
          }
          pBVar178 = pBVar181;
          uVar158 = (long)pBVar178 - (long)pBVar182;
          if ((long)uVar158 < 0x91) goto LAB_00426e7a;
        } while (uVar160 != 0);
        pBVar163 = pBVar174 + 1;
        local_488 = (atomic<int> *)(((long)pBVar163 - (long)pBVar182 >> 4) * -0x5555555555555555);
        pvVar148 = bvhPrimitives;
        local_478 = this_01;
        local_468 = pBVar174;
        local_470 = pBVar178;
        local_480 = bvhPrimitives;
        if (0x5f < (long)pBVar163 - (long)pBVar182) {
          uVar158 = (ulong)((long)&local_488[-1].super___atomic_base<int>._M_i + 2U) >> 1;
          pBVar164 = pBVar182 + uVar158;
          do {
            uVar136 = pBVar164->primitiveIndex;
            auVar137 = *(undefined1 (*) [12])&(pBVar164->bounds).pMin;
            auVar138 = *(undefined1 (*) [12])&(pBVar164->bounds).pMax;
            __value.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar138;
            __value.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar137;
            __value.primitiveIndex = uVar136;
            __value._32_16_ =
                 SUB3216(*(undefined1 (*) [32])
                          &(pBVar164->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z,0x10);
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                      (pBVar182,uVar158,(long)local_488,__value,__comp);
            pBVar164 = pBVar164 + -1;
            bVar183 = uVar158 != 0;
            uVar158 = uVar158 - 1;
            pvVar148 = local_480;
            pBVar178 = local_470;
            pBVar174 = local_468;
          } while (bVar183);
        }
        for (; pBVar181 = local_468, pBVar168 = local_470, pvVar155 = local_480,
            bVar183 = pBVar163 < local_470, bvhPrimitives = local_480, local_480 = pvVar148,
            local_470 = pBVar178, local_468 = pBVar174, bVar183; pBVar163 = pBVar163 + 1) {
          if (*(float *)((long)&pBVar163->primitiveIndex + lVar157) <
              *(float *)((long)&pBVar182->primitiveIndex + lVar157)) {
            uVar51 = (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar52 = (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pfVar162 = &(pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar8 = *(undefined8 *)pfVar162;
            uVar53 = (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar54 = (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar142 = pBVar163->primitiveIndex;
            auVar143 = *(undefined1 (*) [12])&(pBVar163->bounds).pMin;
            auVar144 = *(undefined1 (*) [12])&(pBVar163->bounds).pMax;
            __value_00.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar144;
            __value_00.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar143;
            __value_00.primitiveIndex = uVar142;
            auVar133 = *(undefined1 (*) [12])pfVar162;
            uVar55 = (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar56 = (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)pBVar163->primitiveIndex;
            local_448._4_4_ = (undefined4)(pBVar163->primitiveIndex >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar24 = pBVar182->primitiveIndex;
            fVar211 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar212 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar206 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar214 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar1 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            fVar19 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar1;
            (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar19;
            pBVar163->primitiveIndex = sVar24;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar211;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar212;
            *(undefined8 *)&(pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar206;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar214;
            auVar131._12_4_ = uVar54;
            auVar131._0_12_ = auVar133;
            auVar131._16_4_ = uVar55;
            auVar131._20_4_ = uVar56;
            auVar131._24_4_ = uStack_420;
            auVar131._28_4_ = uStack_41c;
            __value_00._32_16_ = auVar131._16_16_;
            local_448._8_4_ = uVar51;
            local_448._12_4_ = uVar52;
            auStack_430[0] = uVar53;
            auStack_430[1] = uVar54;
            auStack_430[2] = uVar55;
            auStack_430[3] = uVar56;
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__2>>
                      (pBVar182,0,(long)local_488,__value_00,__comp);
          }
          pvVar148 = local_480;
          pBVar178 = local_470;
          pBVar174 = local_468;
          local_468 = pBVar181;
          local_470 = pBVar168;
          local_480 = pvVar155;
        }
      }
      else {
        if (this->splitMethod == EqualCounts) {
          pBVar174 = (bvhPrimitives->
                     super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          goto LAB_004266c8;
        }
        if (2 < (int)uVar161) {
          auVar213 = vpmovsxwd_avx512f(_DAT_0061fa60);
          auVar191 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
          auVar192 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
          p_Var167 = &local_448;
          vpscatterdd_avx512f(ZEXT864(p_Var167) + auVar213,0xfff,ZEXT1664(ZEXT816(0) << 0x40));
          vscatterdps_avx512f(ZEXT864(p_Var167) + ZEXT864(4) + auVar213,0xfff,auVar191);
          vscatterdps_avx512f(ZEXT864(p_Var167) + _DAT_0061f040,0xfff,auVar191);
          vscatterdps_avx512f(ZEXT864(p_Var167) + auVar208,0xfff,auVar191);
          vscatterdps_avx512f(ZEXT864(p_Var167) + _DAT_0061f0c0,0xfff,auVar192);
          vscatterdps_avx512f(ZEXT864(p_Var167) + auVar208,0xfff,auVar192);
          vscatterdps_avx512f(ZEXT864(p_Var167) + _DAT_0061f140,0xfff,auVar192);
          if (local_490 < local_494) {
            p_Var167 = (_Any_data *)
                       &(bvhPrimitives->
                        super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)
                        ._M_impl.super__Vector_impl_data._M_start[lVar159].centroid.
                        super_Tuple3<pbrt::Point3,_float>.z;
            lVar166 = lVar157 - lVar159;
            auVar213 = _DAT_0061f140;
            do {
              uVar5 = ((Tuple3<pbrt::Point3,_float> *)((long)p_Var167 - 8U))->x;
              uVar12 = ((Tuple3<pbrt::Point3,_float> *)((long)p_Var167 - 8U))->y;
              auVar185._4_4_ = uVar12;
              auVar185._0_4_ = uVar5;
              auVar185._8_8_ = 0;
              uVar158 = vcmpps_avx512vl(auVar210,auVar188,1);
              auVar186 = vsubps_avx(auVar185,auVar210);
              auVar194._16_48_ = auVar213._16_48_;
              auVar185 = vdivps_avx512vl(auVar186,auVar18);
              bVar183 = (bool)((byte)uVar158 & 1);
              auVar187._0_4_ = (uint)bVar183 * auVar185._0_4_ | (uint)!bVar183 * auVar186._0_4_;
              bVar183 = (bool)((byte)(uVar158 >> 1) & 1);
              auVar187._4_4_ = (uint)bVar183 * auVar185._4_4_ | (uint)!bVar183 * auVar186._4_4_;
              bVar183 = (bool)((byte)(uVar158 >> 2) & 1);
              auVar187._8_4_ = (uint)bVar183 * auVar185._8_4_ | (uint)!bVar183 * auVar186._8_4_;
              bVar183 = (bool)((byte)(uVar158 >> 3) & 1);
              auVar187._12_4_ = (uint)bVar183 * auVar185._12_4_ | (uint)!bVar183 * auVar186._12_4_;
              if (fVar212 < fVar211) {
                auVar186 = vmovshdup_avx(auVar186);
                auVar189._0_4_ = auVar186._0_4_ / fVar19;
                auVar189._4_12_ = auVar186._4_12_;
                auVar186 = vinsertps_avx(auVar187,auVar189,0x10);
              }
              else {
                auVar186 = vblendps_avx(auVar187,auVar186,2);
              }
              if (__comp._M_comp.dim != 0) {
                if (__comp._M_comp.dim == 1) {
                  auVar186 = vmovshdup_avx(auVar186);
                }
                else {
                  uVar8 = vcmpss_avx512f(auVar207,auVar195,1);
                  bVar183 = (bool)((byte)uVar8 & 1);
                  fVar20 = *(float *)p_Var167 - fVar206;
                  auVar194._0_16_ = ZEXT416((uint)fVar20);
                  auVar193._4_60_ = auVar194._4_60_;
                  auVar193._0_4_ =
                       (uint)bVar183 * (int)(fVar20 / fVar1) + (uint)!bVar183 * (int)fVar20;
                  auVar186 = auVar193._0_16_;
                }
              }
              auVar186 = vmulss_avx512f(auVar186,ZEXT416(0x41400000));
              iVar156 = 0xb;
              if ((int)auVar186._0_4_ != 0xc) {
                iVar156 = (int)auVar186._0_4_;
              }
              lVar175 = (long)iVar156;
              lVar23 = lVar175 * 0x1c;
              *(int *)((long)&local_448 + lVar23) = *(int *)((long)&local_448 + lVar23) + 1;
              auVar190._8_8_ = 0;
              auVar190._0_8_ = *(ulong *)(p_Var167 + -2);
              auVar215._8_8_ = 0;
              auVar215._0_8_ = *(ulong *)((long)&local_448 + lVar23 + 4);
              auVar187 = vminss_avx512f(ZEXT416((uint)*(float *)((long)p_Var167 - 0x18)),
                                        ZEXT416(*(uint *)((long)&local_448 + lVar175 * 0x1c + 0xc)))
              ;
              auVar186 = vminps_avx(auVar190,auVar215);
              auVar216._8_8_ = 0;
              auVar216._0_8_ = *(ulong *)((long)&uStack_438 + lVar175 * 0x1cU);
              auVar219._8_8_ = 0;
              auVar219._0_8_ = *(ulong *)((long)p_Var167 - 0x14);
              auVar185 = vmaxps_avx512vl(auVar219,auVar216);
              pfVar162 = (float *)((long)p_Var167 - 0xc);
              p_Var167 = p_Var167 + 3;
              lVar166 = lVar166 + -1;
              auVar213._0_16_ =
                   vmaxss_avx512f(ZEXT416((uint)*pfVar162),ZEXT416(auStack_430[lVar175 * 7]));
              auVar213._16_48_ = auVar194._16_48_;
              uVar8 = vmovlps_avx(auVar186);
              *(undefined8 *)((long)&local_448 + lVar23 + 4) = uVar8;
              *(int *)((long)&local_448 + lVar175 * 0x1c + 0xc) = auVar187._0_4_;
              uVar8 = vmovlps_avx(auVar185);
              *(undefined8 *)((long)&uStack_438 + lVar175 * 0x1cU) = uVar8;
              auStack_430[lVar175 * 7] = auVar213._0_4_;
            } while (lVar166 != 0);
          }
          piVar172 = aiStack_198 + 0xd;
          uVar158 = CONCAT62((int6)((ulong)p_Var167 >> 0x10),0x7ff) & 0xffffffff;
          piVar173 = aiStack_198 + 0x18;
          vscatterdps_avx512f(ZEXT864(&local_2a8) + _DAT_0061f180,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(&local_2a8) + ZEXT864(4) + _DAT_0061f180,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(&local_2a8) + _DAT_0061f1c0,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(&local_2a8) + auVar208,uVar158,auVar192);
          vscatterdps_avx512f(ZEXT864(&local_2a8) + auVar202,uVar158,auVar192);
          vscatterdps_avx512f(ZEXT864(&local_2a8) + auVar204,uVar158,auVar192);
          vscatterdps_avx512f(ZEXT864(piVar173) + _DAT_0061f180,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(piVar173) + ZEXT864(4) + _DAT_0061f180,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(piVar173) + _DAT_0061f1c0,uVar158,auVar191);
          vscatterdps_avx512f(ZEXT864(piVar173) + auVar208,uVar158,auVar192);
          vscatterdps_avx512f(ZEXT864(piVar173) + auVar202,uVar158,auVar192);
          vscatterdps_avx512f(ZEXT864(piVar173) + auVar204,uVar158,auVar192);
          local_2a8 = (BVHBuildNode *)CONCAT44(local_448._8_4_,local_448._4_4_);
          pBStack_2a0 = (BVHBuildNode *)CONCAT44(uStack_438,local_448._12_4_);
          lVar166 = 0xd;
          aiStack_198[0xc] = local_448._0_4_;
          auVar204 = ZEXT464((uint)local_448._4_4_);
          auVar202 = ZEXT464((uint)local_448._12_4_);
          auVar213 = ZEXT464(uStack_438);
          auVar208 = ZEXT464(auStack_430[0]);
          puVar176 = local_27c;
          uVar165 = local_448._0_4_;
          do {
            uVar2 = *(uint *)((long)&local_458 + lVar166 * 4 + 4);
            uVar158 = *(ulong *)(local_460 + lVar166 * 4 + 4);
            auVar188 = vinsertps_avx(auVar204._0_16_,ZEXT416((uint)puVar176[-10]),0x10);
            uVar160 = *(ulong *)((long)&local_450 + lVar166 * 4);
            auVar186 = vinsertps_avx512f(auVar213._0_16_,ZEXT416((uint)puVar176[-7]),0x10);
            uVar165 = uVar165 + *(int *)(local_460 + lVar166 * 4);
            *piVar172 = uVar165;
            piVar172 = piVar172 + 1;
            auVar187 = vminss_avx512f(ZEXT416(uVar2),auVar202._0_16_);
            auVar202 = ZEXT1664(auVar187);
            uVar2 = *(uint *)((long)&local_448 + lVar166 * 4);
            auVar217._8_8_ = 0;
            auVar217._0_8_ = uVar158;
            auVar188 = vminps_avx512vl(auVar217,auVar188);
            auVar204 = ZEXT1664(auVar188);
            auVar220._8_8_ = 0;
            auVar220._0_8_ = uVar160;
            auVar186 = vmaxps_avx512vl(auVar220,auVar186);
            auVar213 = ZEXT1664(auVar186);
            lVar166 = lVar166 + 7;
            uVar8 = vmovlps_avx(auVar188);
            *(undefined8 *)(puVar176 + -5) = uVar8;
            puVar176[-3] = auVar187._0_4_;
            uVar8 = vmovlps_avx512f(auVar186);
            *(undefined8 *)(puVar176 + -2) = uVar8;
            auVar188 = vmaxss_avx512f(ZEXT416(uVar2),auVar208._0_16_);
            auVar208 = ZEXT1664(auVar188);
            *puVar176 = auVar188._0_4_;
            puVar176 = puVar176 + 6;
          } while (lVar166 != 0x53);
          puVar177 = local_60;
          piVar173 = aiStack_198 + 9;
          uStack_38 = local_300;
          uVar32 = uStack_38;
          lVar166 = 0x118;
          aiStack_198[10] = local_314;
          local_48 = local_310;
          uVar8 = local_48;
          uStack_40 = uStack_308;
          uVar21 = uStack_40;
          local_48._0_4_ = (uint)local_310;
          auVar204 = ZEXT464((uint)local_48);
          uStack_40._0_4_ = (uint)uStack_308;
          auVar202 = ZEXT464((uint)uStack_40);
          uStack_40._4_4_ = (uint)((ulong)uStack_308 >> 0x20);
          auVar213 = ZEXT464(uStack_40._4_4_);
          uStack_38._4_4_ = (uint)((ulong)local_300 >> 0x20);
          auVar208 = ZEXT464(uStack_38._4_4_);
          do {
            uVar2 = *(uint *)((long)&local_448 + lVar166 + 0xc);
            uVar158 = *(ulong *)((long)&local_448 + lVar166 + 4);
            auVar188 = vinsertps_avx(auVar204._0_16_,ZEXT416(*(uint *)((long)puVar177 + 0x1c)),0x10)
            ;
            uVar160 = *(ulong *)((long)&uStack_438 + lVar166);
            auVar186 = vinsertps_avx512f(auVar213._0_16_,ZEXT416(*(uint *)(puVar177 + 5)),0x10);
            local_314 = local_314 + *(int *)((long)&local_448 + lVar166);
            *piVar173 = local_314;
            piVar173 = piVar173 + -1;
            auVar187 = vminss_avx512f(ZEXT416(uVar2),auVar202._0_16_);
            auVar202 = ZEXT1664(auVar187);
            uVar2 = *(uint *)((long)auStack_430 + lVar166);
            auVar218._8_8_ = 0;
            auVar218._0_8_ = uVar158;
            auVar188 = vminps_avx512vl(auVar218,auVar188);
            auVar204 = ZEXT1664(auVar188);
            auVar221._8_8_ = 0;
            auVar221._0_8_ = uVar160;
            auVar186 = vmaxps_avx512vl(auVar221,auVar186);
            auVar213 = ZEXT1664(auVar186);
            uVar9 = vmovlps_avx(auVar188);
            *puVar177 = uVar9;
            *(int *)(puVar177 + 1) = auVar187._0_4_;
            uVar9 = vmovlps_avx512f(auVar186);
            *(undefined8 *)((long)puVar177 + 0xc) = uVar9;
            auVar188 = vmaxss_avx512f(ZEXT416(uVar2),auVar208._0_16_);
            auVar208 = ZEXT1664(auVar188);
            *(int *)((long)puVar177 + 0x14) = auVar188._0_4_;
            puVar177 = puVar177 + -3;
            lVar166 = lVar166 + -0x1c;
          } while (lVar166 != 0);
          auVar202 = ZEXT464(0x7f800000);
          uVar158 = 0xffffffff;
          lVar166 = 0x14;
          uVar160 = 0;
          do {
            if (aiStack_198[uVar160 + 0xc] != 0) {
              iVar156 = aiStack_198[uVar160];
              if (iVar156 != 0) {
                auVar188 = vsubss_avx512f(ZEXT416(*(uint *)((long)auStack_2bc + lVar166 + 0xc)),
                                          ZEXT416(*(uint *)((long)auStack_2bc + lVar166)));
                auVar186 = vsubss_avx512f(ZEXT416(*(uint *)((long)&local_2a8 + lVar166)),
                                          ZEXT416(*(uint *)((long)auStack_2bc + lVar166 + 8)));
                auVar187 = vsubss_avx512f(ZEXT416(*(uint *)((long)auStack_2bc + lVar166 + 0x10)),
                                          ZEXT416(*(uint *)((long)auStack_2bc + lVar166 + 4)));
                auVar185 = vsubss_avx512f(ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x60)),
                                          ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x54)));
                auVar189 = vmulss_avx512f(auVar188,auVar186);
                auVar188 = vfmadd231ss_avx512f(auVar189,auVar187,auVar188);
                auVar186 = vfmadd231ss_avx512f(auVar188,auVar187,auVar186);
                auVar188 = vcvtsi2ss_avx512f(ZEXT416((uint)fVar19),iVar156);
                auVar187 = vsubss_avx512f(ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x58)),
                                          ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x4c)));
                auVar186 = vaddss_avx512f(auVar186,auVar186);
                auVar189 = vsubss_avx512f(ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x5c)),
                                          ZEXT416(*(uint *)((long)aiStack_198 + lVar166 + 0x50)));
                auVar190 = vmulss_avx512f(auVar187,auVar185);
                auVar187 = vfmadd231ss_avx512f(auVar190,auVar189,auVar187);
                auVar187 = vfmadd231ss_avx512f(auVar187,auVar189,auVar185);
                auVar187 = vaddss_avx512f(auVar187,auVar187);
                auVar188 = vmulss_avx512f(auVar187,auVar188);
                auVar186 = vfmadd231ss_avx512f(auVar188,ZEXT416((uint)(float)aiStack_198
                                                                             [uVar160 + 0xc]),
                                               auVar186);
                auVar188 = vucomiss_avx512f(auVar186);
                auVar188 = vminss_avx512f(auVar186,auVar188);
                auVar202 = ZEXT1664(auVar188);
                if (iVar156 != 0) {
                  uVar158 = uVar160 & 0xffffffff;
                }
              }
            }
            uVar160 = uVar160 + 1;
            lVar166 = lVar166 + 0x18;
          } while (uVar160 != 0xb);
          if ((this->maxPrimsInNode < (int)uVar161) ||
             (auVar202._0_4_ / fVar184 + 0.5 < (float)(int)uVar161)) {
            pBVar178 = (bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            pBVar174 = pBVar178 + lVar159;
            if (local_490 != local_494) {
              uVar9 = vcmpss_avx512f(auVar207,auVar195,1);
              bVar183 = (bool)((byte)uVar9 & 1);
              pBVar182 = pBVar174;
              pBVar174 = pBVar178 + lVar157;
              do {
                while( true ) {
                  pBVar178 = pBVar182;
                  uVar6 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar13 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                  auVar198._4_4_ = uVar13;
                  auVar198._0_4_ = uVar6;
                  auVar198._8_8_ = 0;
                  auVar205 = vsubps_avx(auVar198,auVar210);
                  auVar196 = auVar205;
                  if (fVar209 < fVar214) {
                    auVar196 = vdivps_avx(auVar205,auVar18);
                  }
                  if (fVar212 < fVar211) {
                    auVar205 = vmovshdup_avx(auVar205);
                    auVar199._0_4_ = auVar205._0_4_ / fVar19;
                    auVar199._4_12_ = auVar205._4_12_;
                    auVar196 = vinsertps_avx(auVar196,auVar199,0x10);
                  }
                  else {
                    auVar196 = vblendps_avx(auVar196,auVar205,2);
                  }
                  fVar184 = auVar196._0_4_;
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      auVar196 = vmovshdup_avx(auVar196);
                      fVar184 = auVar196._0_4_;
                    }
                    else {
                      fVar184 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z - fVar206;
                      fVar184 = (float)((uint)bVar183 * (int)(fVar184 / fVar1) +
                                       (uint)!bVar183 * (int)fVar184);
                    }
                  }
                  iVar156 = (int)(fVar184 * 12.0);
                  if (iVar156 == 0xc) {
                    iVar156 = 0xb;
                  }
                  if ((int)uVar158 < iVar156) break;
                  pBVar182 = pBVar178 + 1;
                  if (pBVar178 + 1 == pBVar174) goto LAB_0042798d;
                }
                do {
                  pBVar182 = pBVar174;
                  pBVar163 = pBVar182 + -1;
                  pBVar174 = pBVar178;
                  if (pBVar163 == pBVar178) goto LAB_0042798d;
                  uVar7 = pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
                  uVar14 = pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar200._4_4_ = uVar14;
                  auVar200._0_4_ = uVar7;
                  auVar200._8_8_ = 0;
                  auVar205 = vsubps_avx(auVar200,auVar210);
                  auVar196 = auVar205;
                  if (fVar209 < fVar214) {
                    auVar196 = vdivps_avx(auVar205,auVar18);
                  }
                  if (fVar212 < fVar211) {
                    auVar205 = vmovshdup_avx(auVar205);
                    auVar201._0_4_ = auVar205._0_4_ / fVar19;
                    auVar201._4_12_ = auVar205._4_12_;
                    auVar196 = vinsertps_avx(auVar196,auVar201,0x10);
                  }
                  else {
                    auVar196 = vblendps_avx(auVar196,auVar205,2);
                  }
                  fVar184 = auVar196._0_4_;
                  if (__comp._M_comp.dim != 0) {
                    if (__comp._M_comp.dim == 1) {
                      auVar196 = vmovshdup_avx(auVar196);
                      fVar184 = auVar196._0_4_;
                    }
                    else {
                      fVar184 = pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z - fVar206;
                      fVar184 = (float)((uint)bVar183 * (int)(fVar184 / fVar1) +
                                       (uint)!bVar183 * (int)fVar184);
                    }
                  }
                  iVar156 = (int)(fVar184 * 12.0);
                  if (iVar156 == 0xc) {
                    iVar156 = 0xb;
                  }
                  pBVar174 = pBVar163;
                } while ((int)uVar158 < iVar156);
                sStack_2d8 = pBVar178->primitiveIndex;
                uVar109 = (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar110 = (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar9 = *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar111 = (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar112 = (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar113 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar114 = (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar115 = *(undefined8 *)&(pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                auStack_2bc[3] = (uint)uVar115;
                auStack_2bc[4] = (uint)((ulong)uVar115 >> 0x20);
                local_2c8 = (undefined4)uVar9;
                uStack_2c4 = (undefined4)((ulong)uVar9 >> 0x20);
                sVar24 = pBVar163->primitiveIndex;
                fVar151 = pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                fVar152 = pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar115 = *(undefined8 *)
                           &pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar153 = pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                fVar154 = pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar184 = pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                fVar197 = pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                fVar203 = pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar116 = *(undefined8 *)
                           &pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                fVar20 = pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
                fVar150 = pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
                (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
                (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
                (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
                *(undefined8 *)&(pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     uVar116;
                (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar20;
                (pBVar178->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar150;
                pBVar178->primitiveIndex = sVar24;
                (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar151;
                (pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar152;
                *(undefined8 *)&(pBVar178->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     uVar115;
                (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar153;
                (pBVar178->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar154;
                uVar115 = CONCAT44(uVar113,uVar112);
                pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar110;
                pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)local_2c8;
                pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_2c4;
                pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar111;
                *(undefined8 *)&pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     uVar115;
                pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar114;
                pBVar182[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)auStack_2bc[3];
                pBVar163->primitiveIndex = sStack_2d8;
                pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar109;
                pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar110;
                *(undefined8 *)&pBVar182[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar9
                ;
                pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar111;
                pBVar182[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar112;
                pBVar182 = pBVar178 + 1;
                auStack_2bc[2] = uVar114;
                auStack_2bc[1] = uVar113;
                auStack_2bc[0] = uVar112;
                uStack_2c0 = uVar111;
                uStack_2cc = uVar110;
                uStack_2d0 = uVar109;
              } while (pBVar163 != pBVar178 + 1);
              pBVar174 = pBVar178 + 1;
            }
LAB_0042798d:
            iVar156 = (int)((ulong)((long)pBVar174 -
                                   (long)(bvhPrimitives->
                                         super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555;
            local_48 = uVar8;
            uStack_40 = uVar21;
            uStack_38 = uVar32;
            goto LAB_0042799f;
          }
          LOCK();
          iVar156 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
          (orderedPrimsOffset->super___atomic_base<int>)._M_i =
               (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar161;
          UNLOCK();
          if (local_490 < local_494) {
            pPVar16 = (this->primitives).
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar17 = (orderedPrims->
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar157 = (long)local_494 - (long)local_490;
            pBVar178 = (bvhPrimitives->
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_490;
            iVar179 = iVar156;
            do {
              psVar149 = &pBVar178->primitiveIndex;
              pBVar178 = pBVar178 + 1;
              pPVar17[iVar179].
              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
              .bits = pPVar16[(int)*psVar149].
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      .bits;
              iVar179 = iVar179 + 1;
              lVar157 = lVar157 + -1;
            } while (lVar157 != 0);
          }
          this_01->firstPrimOffset = iVar156;
          this_01->nPrimitives = uVar161;
          uVar8 = vmovlps_avx(auVar205);
          (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
          (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar8 >> 0x20);
          (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar203;
          uVar8 = vmovlps_avx(auVar196);
          (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
          (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar8 >> 0x20);
          (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar197;
          uVar158 = (ulong)uVar161;
          goto LAB_004265dd;
        }
        if (local_48c == local_494 || local_490 == local_494) goto LAB_0042799f;
        pBVar174 = (bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar178 = pBVar174 + lVar157;
        pBVar182 = pBVar174 + lVar159;
        uVar158 = lVar157 * 0x30 + lVar159 * -0x30;
        if ((long)uVar158 < 0x91) {
LAB_004277d8:
          if ((pBVar182 != pBVar178) && (pBVar174 = pBVar182 + 1, pBVar174 != pBVar178)) {
            pBVar163 = pBVar182;
            lVar157 = 0x20;
            if ((uVar22 & 1) != 0) {
              lVar157 = (ulong)((byte)(~bVar170 | fVar19 <= fVar1) & 1) * 4 + 0x24;
            }
            do {
              pBVar168 = pBVar174;
              if (*(float *)((long)&pBVar182->primitiveIndex + lVar157) <=
                  *(float *)((long)&pBVar168->primitiveIndex + lVar157)) {
                sVar24 = pBVar168->primitiveIndex;
                uVar123 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar124 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar125 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar126 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar127 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar128 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar21 = *(undefined8 *)&(pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                auStack_430[2] = uVar127;
                auStack_430[3] = uVar128;
                uStack_420 = (undefined4)uVar21;
                uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
                local_448._0_4_ = (undefined4)sVar24;
                local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
                local_448._8_4_ = uVar123;
                local_448._12_4_ = uVar124;
                uStack_438 = (uint)uVar8;
                uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
                auStack_430[0] = uVar125;
                auStack_430[1] = uVar126;
                fVar184 = *(float *)((long)&local_448 + lVar157);
                fVar197 = *(float *)((long)&pBVar163->primitiveIndex + lVar157);
                pBVar174 = pBVar168;
                while (fVar184 < fVar197) {
                  sVar31 = pBVar174[-1].primitiveIndex;
                  fVar197 = pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar203 = pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  uVar21 = *(undefined8 *)
                            &pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                  fVar1 = pBVar174[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                  fVar19 = pBVar174[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                  *(undefined1 (*) [32])&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y
                       = *(undefined1 (*) [32])
                          &pBVar174[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                  pBVar174->primitiveIndex = sVar31;
                  (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
                  (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
                  *(undefined8 *)&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       uVar21;
                  (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar1;
                  (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar19;
                  fVar197 = *(float *)((long)&pBVar174[-2].primitiveIndex + lVar157);
                  pBVar174 = pBVar174 + -1;
                }
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar124;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar125;
                *(ulong *)&(pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(auStack_430[2],auStack_430[1]);
                (pBVar174->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar128;
                (pBVar174->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
                pBVar174->primitiveIndex = sVar24;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar123;
                (pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar124;
                *(undefined8 *)&(pBVar174->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar125;
                (pBVar174->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar126;
              }
              else {
                uVar117 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
                uVar118 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
                uVar8 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
                uVar119 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
                uVar120 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
                uVar121 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.x;
                uVar122 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
                uVar21 = *(undefined8 *)&(pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
                uStack_420 = (undefined4)uVar21;
                uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
                local_448._0_4_ = (undefined4)pBVar168->primitiveIndex;
                local_448._4_4_ = (undefined4)(pBVar168->primitiveIndex >> 0x20);
                uStack_438 = (uint)uVar8;
                uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
                local_448._8_4_ = uVar117;
                local_448._12_4_ = uVar118;
                auStack_430[0] = uVar119;
                auStack_430[1] = uVar120;
                auStack_430[2] = uVar121;
                auStack_430[3] = uVar122;
                memmove((void *)((long)pBVar163 + (0x60 - ((long)pBVar168 - (long)pBVar182))),
                        pBVar182,(long)pBVar168 - (long)pBVar182);
                pBVar182->primitiveIndex = CONCAT44(local_448._4_4_,local_448._0_4_);
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_448._8_4_
                ;
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                *(ulong *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(uStack_434,uStack_438);
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)auStack_430[1];
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     (float)local_448._12_4_;
                (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
                (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[0];
                *(ulong *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(auStack_430[2],auStack_430[1]);
                (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)auStack_430[3];
                (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
              }
              pBVar174 = pBVar168 + 1;
              pBVar163 = pBVar168;
              iVar156 = local_48c;
            } while (pBVar168 + 1 != pBVar178);
          }
          goto LAB_0042799f;
        }
        pBVar174 = pBVar174 + local_48c;
        lVar157 = 0x20;
        if ((uVar22 & 1) != 0) {
          lVar157 = (ulong)((byte)(~bVar170 | fVar19 <= fVar1) & 1) * 4 + 0x24;
        }
        uVar160 = (ulong)(uint)((int)LZCOUNT((uVar158 >> 4) * -0x5555555555555555) * 2) ^ 0x7e;
        do {
          fVar184 = *(float *)((long)&pBVar182[1].primitiveIndex + lVar157);
          fVar197 = *(float *)((long)&pBVar178[-1].primitiveIndex + lVar157);
          pBVar163 = pBVar182 + 1;
          pBVar168 = pBVar182 + uVar158 / 0x60;
          fVar203 = *(float *)((long)&pBVar168->primitiveIndex + lVar157);
          if (fVar203 <= fVar184) {
            if (fVar197 <= fVar184) {
              if (fVar203 < fVar197) goto LAB_00426bb4;
              goto LAB_00426c08;
            }
LAB_00426b5b:
            sVar24 = pBVar182->primitiveIndex;
            uVar57 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar58 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar59 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar60 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar61 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar62 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar163->primitiveIndex;
            fVar206 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar61,uVar60);
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar58;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar59;
            *(undefined8 *)&pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar62;
            pBVar182[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar163->primitiveIndex = sVar24;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar57;
            pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar58;
            *(undefined8 *)&pBVar182[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar59;
            pBVar182[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar60;
            local_448._8_4_ = uVar57;
            local_448._12_4_ = uVar58;
            auStack_430[0] = uVar59;
            auStack_430[1] = uVar60;
            auStack_430[2] = uVar61;
            auStack_430[3] = uVar62;
          }
          else if (fVar203 < fVar197) {
LAB_00426c08:
            sVar24 = pBVar182->primitiveIndex;
            uVar69 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar70 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar71 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar72 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar73 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar74 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar168->primitiveIndex;
            fVar206 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&(pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar73,uVar72);
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar70;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar71;
            *(undefined8 *)&(pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar74;
            (pBVar168->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar168->primitiveIndex = sVar24;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar69;
            (pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar70;
            *(undefined8 *)&(pBVar168->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar71;
            (pBVar168->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar72;
            local_448._8_4_ = uVar69;
            local_448._12_4_ = uVar70;
            auStack_430[0] = uVar71;
            auStack_430[1] = uVar72;
            auStack_430[2] = uVar73;
            auStack_430[3] = uVar74;
          }
          else {
            if (fVar197 <= fVar184) goto LAB_00426b5b;
LAB_00426bb4:
            sVar24 = pBVar182->primitiveIndex;
            uVar63 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar64 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar65 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar66 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar67 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar68 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar178[-1].primitiveIndex;
            fVar206 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar182->primitiveIndex = sVar31;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar67,uVar66);
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar64;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar65;
            *(undefined8 *)&pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar68;
            pBVar178[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar178[-1].primitiveIndex = sVar24;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar63;
            pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar64;
            *(undefined8 *)&pBVar178[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar65;
            pBVar178[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar66;
            local_448._8_4_ = uVar63;
            local_448._12_4_ = uVar64;
            auStack_430[0] = uVar65;
            auStack_430[1] = uVar66;
            auStack_430[2] = uVar67;
            auStack_430[3] = uVar68;
          }
          uVar160 = uVar160 - 1;
          pBVar168 = pBVar178;
          while( true ) {
            fVar184 = *(float *)((long)&pBVar182->primitiveIndex + lVar157);
            pBVar181 = pBVar163 + -1;
            do {
              pBVar171 = pBVar181;
              pBVar181 = pBVar171 + 1;
            } while (*(float *)((long)&pBVar171[1].primitiveIndex + lVar157) < fVar184);
            pBVar163 = pBVar171 + 2;
            do {
              pBVar169 = pBVar168;
              pBVar168 = pBVar169 + -1;
            } while (fVar184 < *(float *)((long)&pBVar169[-1].primitiveIndex + lVar157));
            if (pBVar168 <= pBVar181) break;
            sVar24 = pBVar181->primitiveIndex;
            uVar75 = pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar76 = pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar77 = pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar78 = pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar79 = pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.x;
            uVar80 = pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)sVar24;
            local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar31 = pBVar168->primitiveIndex;
            fVar206 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar214 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar209 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar20 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar32 = *(undefined8 *)&pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar211 = pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y;
            fVar212 = pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
            pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.y = fVar211;
            pBVar171[1].centroid.super_Tuple3<pbrt::Point3,_float>.z = fVar212;
            pBVar181->primitiveIndex = sVar31;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar206;
            pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar214;
            *(undefined8 *)&pBVar171[1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar209;
            pBVar171[1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar20;
            uVar21 = CONCAT44(uVar79,uVar78);
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar76;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar77;
            *(undefined8 *)&pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar80;
            pBVar169[-1].centroid.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
            pBVar168->primitiveIndex = sVar24;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar75;
            pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar76;
            *(undefined8 *)&pBVar169[-1].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar77;
            pBVar169[-1].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar78;
            local_448._8_4_ = uVar75;
            local_448._12_4_ = uVar76;
            auStack_430[0] = uVar77;
            auStack_430[1] = uVar78;
            auStack_430[2] = uVar79;
            auStack_430[3] = uVar80;
          }
          if (pBVar181 <= pBVar174) {
            pBVar182 = pBVar181;
            pBVar181 = pBVar178;
          }
          pBVar178 = pBVar181;
          uVar158 = (long)pBVar178 - (long)pBVar182;
          if ((long)uVar158 < 0x91) goto LAB_004277d8;
        } while (uVar160 != 0);
        pBVar163 = pBVar174 + 1;
        local_488 = (atomic<int> *)(((long)pBVar163 - (long)pBVar182 >> 4) * -0x5555555555555555);
        pvVar148 = bvhPrimitives;
        local_478 = this_01;
        local_468 = pBVar174;
        local_470 = pBVar178;
        local_480 = bvhPrimitives;
        if (0x5f < (long)pBVar163 - (long)pBVar182) {
          uVar158 = (ulong)((long)&local_488[-1].super___atomic_base<int>._M_i + 2U) >> 1;
          pBVar164 = pBVar182 + uVar158;
          do {
            uVar139 = pBVar164->primitiveIndex;
            auVar140 = *(undefined1 (*) [12])&(pBVar164->bounds).pMin;
            auVar141 = *(undefined1 (*) [12])&(pBVar164->bounds).pMax;
            __value_01.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar141;
            __value_01.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar140;
            __value_01.primitiveIndex = uVar139;
            __value_01._32_16_ =
                 SUB3216(*(undefined1 (*) [32])
                          &(pBVar164->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z,0x10);
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                      (pBVar182,uVar158,(long)local_488,__value_01,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:271:38)>
                        )__comp._M_comp.dim);
            pBVar164 = pBVar164 + -1;
            bVar183 = uVar158 != 0;
            uVar158 = uVar158 - 1;
            pvVar148 = local_480;
            pBVar178 = local_470;
            pBVar174 = local_468;
          } while (bVar183);
        }
        for (; pBVar181 = local_468, pBVar168 = local_470, pvVar155 = local_480,
            bVar183 = pBVar163 < local_470, bvhPrimitives = local_480, local_480 = pvVar148,
            local_470 = pBVar178, local_468 = pBVar174, bVar183; pBVar163 = pBVar163 + 1) {
          if (*(float *)((long)&pBVar163->primitiveIndex + lVar157) <
              *(float *)((long)&pBVar182->primitiveIndex + lVar157)) {
            uVar81 = (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar82 = (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            pfVar162 = &(pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar8 = *(undefined8 *)pfVar162;
            uVar83 = (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar84 = (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            uVar145 = pBVar163->primitiveIndex;
            auVar146 = *(undefined1 (*) [12])&(pBVar163->bounds).pMin;
            auVar147 = *(undefined1 (*) [12])&(pBVar163->bounds).pMax;
            __value_02.bounds.pMax.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar147;
            __value_02.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
                 (Tuple3<pbrt::Point3,_float>)auVar146;
            __value_02.primitiveIndex = uVar145;
            auVar133 = *(undefined1 (*) [12])pfVar162;
            uVar85 = (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.x;
            uVar86 = (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            uStack_420 = (undefined4)uVar21;
            uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
            local_448._0_4_ = (undefined4)pBVar163->primitiveIndex;
            local_448._4_4_ = (undefined4)(pBVar163->primitiveIndex >> 0x20);
            uStack_438 = (uint)uVar8;
            uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
            sVar24 = pBVar182->primitiveIndex;
            fVar211 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
            fVar212 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar206 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            fVar214 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar184 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
            fVar197 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
            fVar203 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
            uVar21 = *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
            fVar1 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
            fVar19 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
            *(undefined8 *)&(pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
            (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar1;
            (pBVar163->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar19;
            pBVar163->primitiveIndex = sVar24;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar211;
            (pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar212;
            *(undefined8 *)&(pBVar163->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar206;
            (pBVar163->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar214;
            auVar132._12_4_ = uVar84;
            auVar132._0_12_ = auVar133;
            auVar132._16_4_ = uVar85;
            auVar132._20_4_ = uVar86;
            auVar132._24_4_ = uStack_420;
            auVar132._28_4_ = uStack_41c;
            __value_02._32_16_ = auVar132._16_16_;
            local_448._8_4_ = uVar81;
            local_448._12_4_ = uVar82;
            auStack_430[0] = uVar83;
            auStack_430[1] = uVar84;
            auStack_430[2] = uVar85;
            auStack_430[3] = uVar86;
            std::
            __adjust_heap<pbrt::BVHPrimitive*,long,pbrt::BVHPrimitive,__gnu_cxx::__ops::_Iter_comp_iter<pbrt::BVHAggregate::buildRecursive(std::vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>&,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>&,int,int,std::atomic<int>*,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__3>>
                      (pBVar182,0,(long)local_488,__value_02,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_anderslanglands[P]pbrt_v4_src_pbrt_cpu_aggregates_cpp:271:38)>
                        )__comp._M_comp.dim);
          }
          pvVar148 = local_480;
          pBVar178 = local_470;
          pBVar174 = local_468;
          local_468 = pBVar181;
          local_470 = pBVar168;
          local_480 = pvVar155;
        }
      }
      sVar24 = pBVar182->primitiveIndex;
      uVar87 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar88 = (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      uVar8 = *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
      uVar89 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      uVar90 = (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      uVar91 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.x;
      uVar92 = (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y;
      uVar21 = *(undefined8 *)&(pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z;
      uStack_420 = (undefined4)uVar21;
      uStack_41c = (undefined4)((ulong)uVar21 >> 0x20);
      local_448._0_4_ = (undefined4)sVar24;
      local_448._4_4_ = (undefined4)(sVar24 >> 0x20);
      uStack_438 = (uint)uVar8;
      uStack_434 = (undefined4)((ulong)uVar8 >> 0x20);
      sVar31 = pBVar181->primitiveIndex;
      fVar211 = (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      fVar212 = (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      uVar21 = *(undefined8 *)&(pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
      fVar206 = (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      fVar214 = (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      fVar184 = (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
      fVar197 = (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      fVar203 = (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      uVar32 = *(undefined8 *)&(pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      fVar1 = (pBVar181->centroid).super_Tuple3<pbrt::Point3,_float>.y;
      fVar19 = (pBVar181->centroid).super_Tuple3<pbrt::Point3,_float>.z;
      (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar184;
      (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = fVar197;
      (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar203;
      *(undefined8 *)&(pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar32;
      (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.y = fVar1;
      (pBVar182->centroid).super_Tuple3<pbrt::Point3,_float>.z = fVar19;
      pBVar182->primitiveIndex = sVar31;
      (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar211;
      (pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar212;
      *(undefined8 *)&(pBVar182->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
      (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar206;
      (pBVar182->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar214;
      uVar21 = CONCAT44(uVar91,uVar90);
      (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar88;
      (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_438;
      (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_434;
      (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar89;
      *(undefined8 *)&(pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar21;
      (pBVar181->centroid).super_Tuple3<pbrt::Point3,_float>.y = (float)uVar92;
      (pBVar181->centroid).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_420;
      pBVar181->primitiveIndex = sVar24;
      (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar87;
      (pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar88;
      *(undefined8 *)&(pBVar181->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar8;
      (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar89;
      (pBVar181->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar90;
      this_01 = local_478;
      iVar156 = local_48c;
      local_448._8_4_ = uVar87;
      local_448._12_4_ = uVar88;
      auStack_430[0] = uVar89;
      auStack_430[1] = uVar90;
      auStack_430[2] = uVar91;
      auStack_430[3] = uVar92;
LAB_0042799f:
      local_48c = iVar156;
      this_00 = local_458;
      threadAllocators_00 = local_460;
      iVar179 = local_48c;
      iVar156 = local_494;
      orderedPrims_00 = orderedPrims;
      if (local_494 - local_490 < 0x20001) {
        local_480 = local_450;
        local_488 = orderedPrimsOffset;
        local_478 = this_01;
        local_2a8 = buildRecursive(local_458,
                                   (vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                                    *)local_460,bvhPrimitives,local_490,local_48c,
                                   (atomic<int> *)local_450,orderedPrimsOffset,orderedPrims);
        this_01 = local_478;
        pBStack_2a0 = buildRecursive(this_00,(vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                                              *)threadAllocators_00,bvhPrimitives,iVar179,iVar156,
                                     (atomic<int> *)local_480,local_488,orderedPrims_00);
      }
      else {
        local_2f0 = 0;
        local_2f8 = (long *)operator_new(0x50);
        *local_2f8 = (long)&local_2a8;
        local_2f8[1] = (long)local_458;
        local_2f8[2] = (long)local_460;
        local_2f8[3] = (long)bvhPrimitives;
        local_2f8[4] = (long)&local_490;
        local_2f8[5] = (long)&local_48c;
        local_2f8[6] = (long)&local_450;
        local_2f8[7] = (long)&orderedPrimsOffset;
        local_2f8[8] = (long)orderedPrims;
        local_2f8[9] = (long)&local_494;
        local_2e0 = std::
                    _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                    ::_M_invoke;
        local_2e8 = std::
                    _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:366:35)>
                    ::_M_manager;
        local_448._8_4_ = 0;
        local_448._12_4_ = 0;
        auStack_430[0] = 0x2e47ee;
        auStack_430[1] = 0;
        uStack_438 = 0x2e47f4;
        uStack_434 = 0;
        local_448._M_unused._M_object = &local_2f8;
        ParallelFor(0,2,(function<void_(long,_long)> *)&local_448);
        if ((code *)CONCAT44(uStack_434,uStack_438) != (code *)0x0) {
          (*(code *)CONCAT44(uStack_434,uStack_438))(&local_448,&local_448,3);
        }
        if (local_2e8 != (code *)0x0) {
          (*local_2e8)(&local_2f8,&local_2f8,3);
        }
      }
      BVHBuildNode::InitInterior(this_01,(int)__comp._M_comp.dim,local_2a8,pBStack_2a0);
      return this_01;
    }
    LOCK();
    iVar156 = (orderedPrimsOffset->super___atomic_base<int>)._M_i;
    (orderedPrimsOffset->super___atomic_base<int>)._M_i =
         (orderedPrimsOffset->super___atomic_base<int>)._M_i + uVar161;
    UNLOCK();
    if (local_490 < local_494) {
      pPVar16 = (this->primitives).
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar17 = (orderedPrims->
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar157 = (long)local_494 - (long)local_490;
      pBVar178 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_490;
      iVar179 = iVar156;
      do {
        psVar149 = &pBVar178->primitiveIndex;
        pBVar178 = pBVar178 + 1;
        pPVar17[iVar179].
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = pPVar16[(int)*psVar149].
                super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                .bits;
        iVar179 = iVar179 + 1;
        lVar157 = lVar157 + -1;
      } while (lVar157 != 0);
    }
  }
  this_01->firstPrimOffset = iVar156;
  uVar158 = (ulong)(int)uVar161;
  this_01->nPrimitives = uVar161;
  uVar8 = vmovlps_avx(auVar205);
  (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this_01->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar203;
  uVar8 = vmovlps_avx(auVar196);
  (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  (this_01->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar197;
LAB_004265dd:
  this_01->children[0] = (BVHBuildNode *)0x0;
  this_01->children[1] = (BVHBuildNode *)0x0;
  *(long *)(in_FS_OFFSET + -0xec) = *(long *)(in_FS_OFFSET + -0xec) + 1;
  *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
  *(ulong *)(in_FS_OFFSET + -0xf2) = *(long *)(in_FS_OFFSET + -0xf2) + uVar158;
  return this_01;
}

Assistant:

BVHBuildNode *BVHAggregate::buildRecursive(std::vector<Allocator> &threadAllocators,
                                           std::vector<BVHPrimitive> &bvhPrimitives,
                                           int start, int end,
                                           std::atomic<int> *totalNodes,
                                           std::atomic<int> *orderedPrimsOffset,
                                           std::vector<PrimitiveHandle> &orderedPrims) {
    DCHECK_NE(start, end);
    Allocator alloc = threadAllocators[ThreadIndex];
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();
    // Initialize _BVHBuildNode_ for primitive range
    ++*totalNodes;
    // Compute bounds of all primitives in BVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, bvhPrimitives[i].bounds);

    int nPrimitives = end - start;
    if (bounds.SurfaceArea() == 0 || nPrimitives == 1) {
        // Create leaf _BVHBuildNode_
        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
        for (int i = start; i < end; ++i) {
            int index = bvhPrimitives[i].primitiveIndex;
            orderedPrims[firstPrimOffset + i - start] = primitives[index];
        }
        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
        return node;

    } else {
        // Compute bound of primitive centroids, choose split dimension _dim_
        Bounds3f centroidBounds;
        for (int i = start; i < end; ++i)
            centroidBounds = Union(centroidBounds, bvhPrimitives[i].centroid);
        int dim = centroidBounds.MaxDimension();

        // Partition primitives into two sets and build children
        int mid = (start + end) / 2;
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim]) {
            // Create leaf _BVHBuildNode_
            int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
            for (int i = start; i < end; ++i) {
                int index = bvhPrimitives[i].primitiveIndex;
                orderedPrims[firstPrimOffset + i - start] = primitives[index];
            }
            node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
            return node;

        } else {
            // Partition primitives based on _splitMethod_
            switch (splitMethod) {
            case SplitMethod::Middle: {
                // Partition primitives through node's midpoint
                Float pmid = (centroidBounds.pMin[dim] + centroidBounds.pMax[dim]) / 2;
                BVHPrimitive *midPtr =
                    std::partition(&bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                                   [dim, pmid](const BVHPrimitive &pi) {
                                       return pi.centroid[dim] < pmid;
                                   });
                mid = midPtr - &bvhPrimitives[0];
                // For lots of prims with large overlapping bounding boxes, this
                // may fail to partition; in that case don't break and fall through
                // to EqualCounts.
                if (mid != start && mid != end)
                    break;
            }
            case SplitMethod::EqualCounts: {
                // Partition primitives into equally sized subsets
                mid = (start + end) / 2;
                std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                 &bvhPrimitives[end - 1] + 1,
                                 [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                     return a.centroid[dim] < b.centroid[dim];
                                 });

                break;
            }
            case SplitMethod::SAH:
            default: {
                // Partition primitives using approximate SAH
                if (nPrimitives <= 2) {
                    // Partition primitives into equally sized subsets
                    mid = (start + end) / 2;
                    std::nth_element(&bvhPrimitives[start], &bvhPrimitives[mid],
                                     &bvhPrimitives[end - 1] + 1,
                                     [dim](const BVHPrimitive &a, const BVHPrimitive &b) {
                                         return a.centroid[dim] < b.centroid[dim];
                                     });

                } else {
                    // Allocate _BVHSplitBucket_ for SAH partition buckets
                    constexpr int nBuckets = 12;
                    BVHSplitBucket buckets[nBuckets];

                    // Initialize _BVHSplitBucket_ for SAH partition buckets
                    for (int i = start; i < end; ++i) {
                        int b = nBuckets *
                                centroidBounds.Offset(bvhPrimitives[i].centroid)[dim];
                        if (b == nBuckets)
                            b = nBuckets - 1;
                        DCHECK_GE(b, 0);
                        DCHECK_LT(b, nBuckets);
                        buckets[b].count++;
                        buckets[b].bounds =
                            Union(buckets[b].bounds, bvhPrimitives[i].bounds);
                    }

                    // Compute costs for splitting after each bucket
                    constexpr int nSplits = nBuckets - 1;
                    int countBelow[nSplits], countAbove[nSplits];
                    Bounds3f boundsBelow[nSplits], boundsAbove[nSplits];
                    // Initialize _countBelow_ and _boundsBelow_ using a forward scan over
                    // splits
                    countBelow[0] = buckets[0].count;
                    boundsBelow[0] = buckets[0].bounds;
                    for (int i = 1; i < nSplits; ++i) {
                        countBelow[i] = countBelow[i - 1] + buckets[i].count;
                        boundsBelow[i] = Union(boundsBelow[i - 1], buckets[i].bounds);
                    }

                    // Initialize _countAbove_ and _boundsAbove_ using a backwards scan
                    // over splits
                    countAbove[nSplits - 1] = buckets[nBuckets - 1].count;
                    boundsAbove[nSplits - 1] = buckets[nBuckets - 1].bounds;
                    for (int i = nSplits - 2; i >= 0; --i) {
                        countAbove[i] = countAbove[i + 1] + buckets[i + 1].count;
                        boundsAbove[i] = Union(boundsAbove[i + 1], buckets[i + 1].bounds);
                    }

                    // Find bucket to split at that minimizes SAH metric
                    int minCostSplitBucket = -1;
                    Float minCost = Infinity;
                    for (int i = 0; i < nSplits; ++i) {
                        // Compute cost for candidate split and update minimum if
                        // necessary
                        if (countBelow[i] == 0 || countAbove[i] == 0)
                            continue;
                        Float cost = (countBelow[i] * boundsBelow[i].SurfaceArea() +
                                      countAbove[i] * boundsAbove[i].SurfaceArea());
                        if (cost < minCost) {
                            minCost = cost;
                            minCostSplitBucket = i;
                        }
                    }
                    // Compute leaf cost and SAH split cost for chosen split
                    Float leafCost = nPrimitives;
                    minCost = 1.f / 2.f + minCost / bounds.SurfaceArea();

                    // Either create leaf or split primitives at selected SAH bucket
                    if (nPrimitives > maxPrimsInNode || minCost < leafCost) {
                        BVHPrimitive *pmid = std::partition(
                            &bvhPrimitives[start], &bvhPrimitives[end - 1] + 1,
                            [=](const BVHPrimitive &bp) {
                                int b =
                                    nBuckets * centroidBounds.Offset(bp.centroid)[dim];
                                if (b == nBuckets)
                                    b = nBuckets - 1;
                                return b <= minCostSplitBucket;
                            });
                        mid = pmid - &bvhPrimitives[0];
                    } else {
                        // Create leaf _BVHBuildNode_
                        int firstPrimOffset = orderedPrimsOffset->fetch_add(nPrimitives);
                        for (int i = start; i < end; ++i) {
                            int index = bvhPrimitives[i].primitiveIndex;
                            orderedPrims[firstPrimOffset + i - start] = primitives[index];
                        }
                        node->InitLeaf(firstPrimOffset, nPrimitives, bounds);
                        return node;
                    }
                }

                break;
            }
            }

            BVHBuildNode *children[2];
            // Recursively build BVHs for _children_
            if (end - start > 128 * 1024) {
                // Recursively build child BVHs in parallel
                ParallelFor(0, 2, [&](int i) {
                    if (i == 0)
                        children[0] =
                            buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                    else
                        children[1] =
                            buildRecursive(threadAllocators, bvhPrimitives, mid, end,
                                           totalNodes, orderedPrimsOffset, orderedPrims);
                });

            } else {
                // Recursively build child BVHs sequentially
                children[0] =
                    buildRecursive(threadAllocators, bvhPrimitives, start, mid,
                                   totalNodes, orderedPrimsOffset, orderedPrims);
                children[1] =
                    buildRecursive(threadAllocators, bvhPrimitives, mid, end, totalNodes,
                                   orderedPrimsOffset, orderedPrims);
            }

            node->InitInterior(dim, children[0], children[1]);
        }
    }

    return node;
}